

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerApp::DisableAllJoiners
          (Error *__return_storage_ptr__,CommissionerApp *this,JoinerType aType)

{
  ErrorCode EVar1;
  element_type *peVar2;
  int iVar3;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar4;
  Error *pEVar5;
  char *begin;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  undefined1 local_f8 [8];
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  parse_func local_d0 [1];
  string local_c8;
  CommissionerDataset local_a8;
  undefined1 local_50 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  CommissionerDataset::CommissionerDataset(&local_a8,&this->mCommDataset);
  local_a8.mPresentFlags._1_1_ = local_a8.mPresentFlags._1_1_ & 0x3f;
  pvVar4 = (vector<unsigned_char,std::allocator<unsigned_char>> *)GetSteeringData(&local_a8,aType);
  iVar3 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar3 == '\0') {
    local_f8._0_4_ = none_type;
    local_f0._M_p = "the commissioner is not active";
    local_e8 = 0x1e;
    local_e0._M_allocated_capacity = 0;
    local_d0[0] = (parse_func)0x0;
    pcVar6 = "the commissioner is not active";
    local_e0._8_8_ = local_f8;
    while (begin = pcVar6, begin != "") {
      pcVar6 = begin + 1;
      if (*begin == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char> *)local_f8);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_f8;
    ::fmt::v10::vformat_abi_cxx11_(&local_c8,(v10 *)0x1f85d8,(string_view)ZEXT816(0x1e),args);
    local_50._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)(local_50 + 8),(string *)&local_c8);
    Error::operator=(__return_storage_ptr__,(Error *)local_50);
    std::__cxx11::string::~string((string *)(local_50 + 8));
    std::__cxx11::string::~string((string *)&local_c8);
  }
  else {
    local_f8._0_4_ = local_f8._0_4_ & 0xffffff00;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
              (pvVar4,local_f8);
    peVar2 = (this->mCommissioner).
             super___shared_ptr<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_Commissioner[0x14])(local_f8,peVar2,&local_a8);
    pEVar5 = Error::operator=(__return_storage_ptr__,(Error *)local_f8);
    EVar1 = pEVar5->mCode;
    std::__cxx11::string::~string((string *)&local_f0);
    if (EVar1 == kNone) {
      MergeDataset(&this->mCommDataset,&local_a8);
      EraseAllJoiners(this,aType);
    }
  }
  CommissionerDataset::~CommissionerDataset(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::DisableAllJoiners(JoinerType aType)
{
    Error error;
    auto  commDataset = mCommDataset;
    commDataset.mPresentFlags &= ~CommissionerDataset::kSessionIdBit;
    commDataset.mPresentFlags &= ~CommissionerDataset::kBorderAgentLocatorBit;
    auto &steeringData = GetSteeringData(commDataset, aType);

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    // Set steering data to all 0 to disable all joiners.
    steeringData = {0x00};
    SuccessOrExit(error = mCommissioner->SetCommissionerDataset(commDataset));

    MergeDataset(mCommDataset, commDataset);
    EraseAllJoiners(aType);

exit:
    return error;
}